

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-reader.c
# Opt level: O3

int check_long_utf16(void)

{
  uchar *puVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [11];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  int iVar32;
  uchar *input;
  long lVar33;
  uint uVar34;
  ulong uVar35;
  ulong uVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [15];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar42 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  yaml_parser_t parser;
  yaml_parser_t local_200;
  undefined1 auVar41 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  byte bVar51;
  byte bVar52;
  byte bVar53;
  char cVar54;
  
  input = (uchar *)malloc(0x30d42);
  if (input == (uchar *)0x0) {
    __assert_fail("buffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dyna-dot[P]libyaml/tests/test-reader.c"
                  ,0x11f,"int check_long_utf16(void)");
  }
  puts("checking a long utf16 sequence...");
  input[0] = 0xff;
  auVar31 = _DAT_001060e0;
  auVar30 = _DAT_001060d0;
  auVar29 = _s__________001060b0;
  auVar28 = _DAT_001060a0;
  input[1] = 0xfe;
  lVar33 = 1;
  do {
    auVar39._8_4_ = 0xffffffff;
    auVar39._0_8_ = 0xffffffff;
    auVar39._12_4_ = 0;
    auVar37._8_4_ = 0xffffffff;
    auVar37._0_8_ = 0xffffffff;
    auVar37._12_4_ = 0;
    auVar40 = packssdw(auVar39,auVar37);
    auVar40 = packsswb(auVar40,auVar40);
    auVar38 = auVar40._0_15_ & auVar29._0_15_ | ~auVar40._0_15_ & auVar28._0_15_;
    cVar54 = auVar38[7];
    auVar48._0_14_ = auVar38._0_14_;
    auVar48[0xe] = cVar54;
    auVar48[0xf] = 4;
    auVar47._14_2_ = auVar48._14_2_;
    auVar47._0_13_ = auVar38._0_13_;
    auVar47[0xd] = 4;
    bVar53 = auVar38[6];
    auVar46._13_3_ = auVar47._13_3_;
    auVar46._0_12_ = auVar38._0_12_;
    auVar46[0xc] = bVar53;
    auVar45._12_4_ = auVar46._12_4_;
    auVar45._0_11_ = auVar38._0_11_;
    auVar45[0xb] = 4;
    bVar52 = auVar38[5];
    auVar44._11_5_ = auVar45._11_5_;
    auVar44._0_10_ = auVar38._0_10_;
    auVar44[10] = bVar52;
    auVar43._10_6_ = auVar44._10_6_;
    auVar43._0_9_ = auVar38._0_9_;
    auVar43[9] = 4;
    bVar51 = auVar38[4];
    auVar42._9_7_ = auVar43._9_7_;
    auVar42._0_8_ = auVar38._0_8_;
    auVar42[8] = bVar51;
    auVar41._8_8_ = auVar42._8_8_;
    auVar41._0_8_ = 0x400000000000000;
    auVar22._9_7_ = 0;
    auVar22._0_9_ = auVar41._7_9_;
    auVar21._10_6_ = 0;
    auVar21._0_10_ = SUB1610(auVar22 << 0x38,6);
    auVar20._11_5_ = 0;
    auVar20._0_11_ = SUB1611(auVar21 << 0x30,5);
    auVar19._12_4_ = 0;
    auVar19._0_12_ = SUB1612(auVar20 << 0x28,4);
    auVar18._13_3_ = 0;
    auVar18._0_13_ = SUB1613(auVar19 << 0x20,3);
    auVar40._14_2_ = 0;
    auVar40._0_14_ = SUB1614(auVar18 << 0x18,2);
    auVar40 = auVar40 << 0x10;
    auVar10[0xd] = 0;
    auVar10._0_13_ = auVar40._0_13_;
    auVar10[0xe] = 4;
    auVar11[0xc] = auVar38[3];
    auVar11._0_12_ = auVar40._0_12_;
    auVar11._13_2_ = auVar10._13_2_;
    auVar12[0xb] = 0;
    auVar12._0_11_ = auVar40._0_11_;
    auVar12._12_3_ = auVar11._12_3_;
    auVar13[10] = 0;
    auVar13._0_10_ = auVar40._0_10_;
    auVar13._11_4_ = auVar12._11_4_;
    auVar14[9] = 0;
    auVar14._0_9_ = auVar40._0_9_;
    auVar14._10_5_ = auVar13._10_5_;
    auVar15[8] = auVar38[2];
    auVar15._0_8_ = auVar40._0_8_;
    auVar15._9_6_ = auVar14._9_6_;
    auVar23._7_8_ = 0;
    auVar23._0_7_ = auVar15._8_7_;
    auVar16._7_8_ = SUB158(auVar23 << 0x40,7);
    auVar16._0_7_ = 0x4000000000000;
    auVar24._9_6_ = 0;
    auVar24._0_9_ = auVar16._6_9_;
    auVar25._1_10_ = SUB1510(auVar24 << 0x30,5);
    auVar25[0] = auVar38[1];
    auVar26._11_4_ = 0;
    auVar26._0_11_ = auVar25;
    auVar27._12_3_ = 0;
    auVar27._0_12_ = SUB1512(auVar26 << 0x20,3);
    auVar17[1] = 0;
    auVar17[0] = auVar38[0];
    auVar17._2_13_ = SUB1513(auVar27 << 0x18,2);
    auVar49._4_4_ = auVar25._0_4_;
    auVar49._0_4_ = auVar15._8_4_;
    auVar49._8_4_ = auVar17._0_4_;
    auVar49._12_3_ = auVar11._12_3_;
    auVar49[0xf] = 0;
    auVar40 = pshufhw(auVar49,auVar49,0xec);
    auVar50._4_4_ = auVar40._4_4_;
    auVar50._12_4_ = auVar40._12_4_;
    auVar50._0_4_ = auVar40._8_4_;
    auVar50._8_4_ = auVar40._0_4_;
    auVar40 = pshuflw(auVar50,auVar50,0x6c);
    auVar40 = auVar40 & auVar30 | auVar31;
    sVar2 = auVar40._0_2_;
    sVar3 = auVar40._2_2_;
    sVar4 = auVar40._4_2_;
    sVar5 = auVar40._6_2_;
    sVar6 = auVar40._8_2_;
    sVar7 = auVar40._10_2_;
    sVar8 = auVar40._12_2_;
    sVar9 = auVar40._14_2_;
    puVar1 = input + lVar33 * 2;
    *puVar1 = (0 < sVar2) * (sVar2 < 0x100) * auVar40[0] - (0xff < sVar2);
    puVar1[1] = (0 < sVar3) * (sVar3 < 0x100) * auVar40[2] - (0xff < sVar3);
    puVar1[2] = (0 < sVar4) * (sVar4 < 0x100) * auVar40[4] - (0xff < sVar4);
    puVar1[3] = (0 < sVar5) * (sVar5 < 0x100) * auVar40[6] - (0xff < sVar5);
    puVar1[4] = (0 < sVar6) * (sVar6 < 0x100) * auVar40[8] - (0xff < sVar6);
    puVar1[5] = (0 < sVar7) * (sVar7 < 0x100) * auVar40[10] - (0xff < sVar7);
    puVar1[6] = (0 < sVar8) * (sVar8 < 0x100) * auVar40[0xc] - (0xff < sVar8);
    puVar1[7] = (0 < sVar9) * (sVar9 < 0x100) * auVar40[0xe] - (0xff < sVar9);
    puVar1[8] = (bVar51 != 0) * (bVar51 < 0x100) * bVar51 - (0xff < bVar51);
    puVar1[9] = '\x04';
    puVar1[10] = (bVar52 != 0) * (bVar52 < 0x100) * bVar52 - (0xff < bVar52);
    puVar1[0xb] = '\x04';
    puVar1[0xc] = (bVar53 != 0) * (bVar53 < 0x100) * bVar53 - (0xff < bVar53);
    puVar1[0xd] = '\x04';
    puVar1[0xe] = (cVar54 != '\0') * ((auVar47._14_2_ & 0xff) < 0x100) * cVar54 -
                  (0xff < (auVar47._14_2_ & 0xff));
    puVar1[0xf] = '\x04';
    lVar33 = lVar33 + 8;
  } while (lVar33 != 0x186a1);
  yaml_parser_initialize(&local_200);
  yaml_parser_set_input_string(&local_200,input,0x30d42);
  uVar35 = 0;
  do {
    if (local_200.unread == 0) {
      iVar32 = yaml_parser_update_buffer(&local_200,1);
      if (iVar32 == 0) goto LAB_001029b7;
      if (local_200.unread == 0) {
        printf("\tnot enough characters at %d\n",uVar35);
        goto LAB_001029e1;
      }
    }
    bVar51 = 0x90;
    if ((uVar35 & 1) == 0) {
      bVar51 = 0xaf;
    }
    uVar36 = (ulong)*local_200.buffer.pointer;
    if (*local_200.buffer.pointer != 0xd0) {
LAB_001029a2:
      printf("\tincorrect UTF-8 sequence: %X %X instead of %X %X\n",uVar36,
             (ulong)local_200.buffer.pointer[1],0xd0);
      goto LAB_001029e1;
    }
    if (bVar51 != local_200.buffer.pointer[1]) {
      uVar36 = 0xd0;
      goto LAB_001029a2;
    }
    local_200.buffer.pointer = local_200.buffer.pointer + 2;
    local_200.unread = local_200.unread - 1;
    uVar34 = (int)uVar35 + 1;
    uVar35 = (ulong)uVar34;
  } while (uVar34 != 100000);
  iVar32 = yaml_parser_update_buffer(&local_200,1);
  if (iVar32 == 0) {
LAB_001029b7:
    printf("\treader error: %s at %ld\n",local_200.problem,local_200.problem_offset);
  }
  else {
    if (*local_200.buffer.pointer == 0) {
      uVar34 = 0;
      goto LAB_001029e6;
    }
    printf("\texpected NUL, found %X (eof=%d, unread=%ld)\n",(ulong)*local_200.buffer.pointer,
           (ulong)(uint)local_200.eof,local_200.unread);
  }
LAB_001029e1:
  uVar34 = 1;
LAB_001029e6:
  yaml_parser_delete(&local_200);
  free(input);
  printf("checking a long utf16 sequence: %d fail(s)\n",(ulong)uVar34);
  return uVar34;
}

Assistant:

int check_long_utf16(void)
{
    yaml_parser_t parser;
    int k = 0;
    int j;
    int failed = 0;
    unsigned char ch0, ch1;
    unsigned char *buffer = (unsigned char *)malloc(2+LONG*2);
    assert(buffer);
    printf("checking a long utf16 sequence...\n");
    buffer[k++] = '\xff';
    buffer[k++] = '\xfe';
    for (j = 0; j < LONG; j ++) {
        if (j % 2) {
            buffer[k++] = '\x10';
            buffer[k++] = '\x04';
        }
        else {
            buffer[k++] = '/';
            buffer[k++] = '\x04';
        }
    }
    yaml_parser_initialize(&parser);
    yaml_parser_set_input_string(&parser, buffer, 2+LONG*2);
    for (k = 0; k < LONG; k++) {
        if (!parser.unread) {
            if (!yaml_parser_update_buffer(&parser, 1)) {
                printf("\treader error: %s at %ld\n", parser.problem, (long)parser.problem_offset);
                failed = 1;
                break;
            }
        }
        if (!parser.unread) {
            printf("\tnot enough characters at %d\n", k);
            failed = 1;
            break;
        }
        if (k % 2) {
            ch0 = '\xd0';
            ch1 = '\x90';
        }
        else {
            ch0 = '\xd0';
            ch1 = '\xaf';
        }
        if (parser.buffer.pointer[0] != ch0 || parser.buffer.pointer[1] != ch1) {
            printf("\tincorrect UTF-8 sequence: %X %X instead of %X %X\n",
                    (int)parser.buffer.pointer[0], (int)parser.buffer.pointer[1],
                    (int)ch0, (int)ch1);
            failed = 1;
            break;
        }
        parser.buffer.pointer += 2;
        parser.unread -= 1;
    }
    if (!failed) {
        if (!yaml_parser_update_buffer(&parser, 1)) {
            printf("\treader error: %s at %ld\n", parser.problem, (long)parser.problem_offset);
            failed = 1;
        }
        else if (parser.buffer.pointer[0] != '\0') {
            printf("\texpected NUL, found %X (eof=%d, unread=%ld)\n", (int)parser.buffer.pointer[0], parser.eof, (long)parser.unread);
            failed = 1;
        }
    }
    yaml_parser_delete(&parser);
    free(buffer);
    printf("checking a long utf16 sequence: %d fail(s)\n", failed);
    return failed;
}